

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeList.h
# Opt level: O1

void __thiscall
Refal2::CNodeList<Refal2::COperation>::Assign
          (CNodeList<Refal2::COperation> *this,CNodeType *_first,CNodeType *_last)

{
  if (this->first != (CNodeType *)0x0) {
    Remove(this,this->first,this->last);
  }
  this->first = (CNodeType *)0x0;
  this->last = (CNodeType *)0x0;
  if ((_first != (CNodeType *)0x0) && (_last != (CNodeType *)0x0)) {
    this->first = _first;
    this->last = _last;
    return;
  }
  __assert_fail("_first != nullptr && _last != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/include/NodeList.h"
                ,0xa5,
                "void Refal2::CNodeList<Refal2::COperation>::Assign(CNodeType *, CNodeType *) [T = Refal2::COperation]"
               );
}

Assistant:

void CNodeList<T>::Assign( CNodeType* _first, CNodeType* _last )
{
	Empty();
	assert( _first != nullptr && _last != nullptr );
	first = _first;
	last = _last;
}